

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::insert
          (NumberStringBuilder *this,int32_t index,NumberStringBuilder *other,UErrorCode *status)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  Field FVar4;
  char16_t *pcVar5;
  Field *pFVar6;
  int local_3c;
  int32_t i;
  int32_t position;
  int32_t count;
  UErrorCode *status_local;
  NumberStringBuilder *other_local;
  int32_t index_local;
  NumberStringBuilder *this_local;
  
  if (this == other) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = other->fLength;
    if (this_local._4_4_ == 0) {
      this_local._4_4_ = 0;
    }
    else {
      iVar3 = prepareForInsert(this,index,this_local._4_4_,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        for (local_3c = 0; local_3c < this_local._4_4_; local_3c = local_3c + 1) {
          cVar2 = charAt(other,local_3c);
          pcVar5 = getCharPtr(this);
          pcVar5[iVar3 + local_3c] = cVar2;
          FVar4 = fieldAt(other,local_3c);
          pFVar6 = getFieldPtr(this);
          pFVar6[iVar3 + local_3c] = FVar4;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t
NumberStringBuilder::insert(int32_t index, const NumberStringBuilder &other, UErrorCode &status) {
    if (this == &other) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t count = other.fLength;
    if (count == 0) {
        // Nothing to insert.
        return 0;
    }
    int32_t position = prepareForInsert(index, count, status);
    if (U_FAILURE(status)) {
        return count;
    }
    for (int32_t i = 0; i < count; i++) {
        getCharPtr()[position + i] = other.charAt(i);
        getFieldPtr()[position + i] = other.fieldAt(i);
    }
    return count;
}